

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

int __thiscall
jsoncons::jsonpath::detail::
parent_node_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(parent_node_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  int iVar1;
  ulong uVar2;
  path_node_type *last;
  path_node_type *extraout_RAX;
  pointer ptr;
  int index;
  path_node_type *ancestor;
  basic_path_node<char> *in_stack_000000f0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_000000f8;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  result_options options;
  fd_set *pfVar5;
  
  iVar4 = 0;
  pfVar5 = __writefds;
  while( true ) {
    options = (result_options)pfVar5;
    uVar2 = 0;
    uVar3 = false;
    if ((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *)__writefds !=
        (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *)0x0) {
      uVar3 = iVar4 < this->ancestor_depth_;
      uVar2 = (ulong)CONCAT31((int3)((uint)iVar4 >> 8),uVar3);
    }
    iVar1 = (int)CONCAT71((int7)(uVar2 >> 8),uVar3);
    if ((bool)uVar3 == false) break;
    __writefds = (fd_set *)basic_path_node<char>::parent((basic_path_node<char> *)__writefds);
    iVar4 = iVar4 + 1;
  }
  if ((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
       *)__writefds !=
      (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
       *)0x0) {
    last = (path_node_type *)
           select<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const>
                     (in_stack_000000f8,in_stack_000000f0);
    if (last != (path_node_type *)0x0) {
      base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::tail_select((base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     *)__timeout,
                    (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     *)__writefds,(reference)CONCAT44(iVar4,in_stack_ffffffffffffffc0),last,
                    (reference)this,(node_receiver_type *)CONCAT17(uVar3,in_stack_ffffffffffffffa8),
                    options);
      last = extraout_RAX;
    }
    iVar1 = (int)last;
  }
  return iVar1;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            const path_node_type* ancestor = std::addressof(last);
            int index = 0;
            while (ancestor != nullptr && index < ancestor_depth_)
            {
                ancestor = ancestor->parent();
                ++index;
            }

            if (ancestor != nullptr)
            {
                pointer ptr = jsoncons::jsonpath::select(root,*ancestor);
                if (ptr != nullptr)
                {
                    this->tail_select(context, root, *ancestor, *ptr, receiver, options);
                }
            }
        }